

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_features.c
# Opt level: O3

void libdeflate_init_x86_cpu_features(void)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  uint in_XCR0;
  u32 manufacturer [3];
  
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar5 = 0;
  if (*puVar1 != 0) {
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar5 = *puVar2;
    uVar4 = puVar2[3];
    uVar8 = uVar5 >> 8 & 0xf;
    uVar7 = uVar5 >> 4 & 0xf;
    if ((uVar8 == 0xf) || (uVar8 == 6)) {
      uVar7 = uVar7 | uVar5 >> 0xc & 0xf0;
    }
    uVar5 = puVar2[2] >> 0x1a & 1;
    uVar6 = uVar5 + 2;
    if ((~uVar4 & 0x80002) != 0) {
      uVar6 = uVar5;
    }
    if ((uVar4 >> 0x1b & 1) == 0) {
      bVar9 = false;
      bVar10 = false;
      uVar5 = uVar6;
    }
    else {
      bVar9 = (~in_XCR0 & 6) == 0;
      uVar5 = uVar6 + 4;
      if (!bVar9) {
        uVar5 = uVar6;
      }
      if ((uVar4 & 0x10000000) == 0) {
        uVar5 = uVar6;
      }
      bVar10 = (~in_XCR0 & 0xe6) == 0;
    }
    if (6 < *puVar1) {
      lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar4 = *(uint *)(lVar3 + 4);
      uVar6 = uVar4 >> 4 & 0x10 | uVar5;
      if (bVar9) {
        uVar6 = *(uint *)(lVar3 + 0xc) >> 2 & 0x100 | uVar4 >> 2 & 8 | uVar6;
      }
      if (bVar10) {
        if ((((uVar8 != 6) ||
             (puVar1[3] != 0x6c65746e || *(long *)(puVar1 + 1) != 0x49656e69756e6547)) ||
            (0x38 < uVar7 - 0x55)) ||
           ((0x180020000a00001U >> ((ulong)(uVar7 - 0x55) & 0x3f) & 1) == 0)) {
          uVar6 = uVar6 | 0x20;
        }
        uVar6 = uVar6 | uVar4 >> 0x18 & 0xffffffc0 | *(uint *)(lVar3 + 0xc) >> 2 & 0x200;
      }
      puVar1 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
      uVar5 = uVar6 + 0x400;
      if ((*puVar1 & 0x10) == 0) {
        uVar5 = uVar6;
      }
      if (!bVar9) {
        uVar5 = uVar6;
      }
    }
  }
  libdeflate_x86_cpu_features = uVar5 | 0x80000000;
  return;
}

Assistant:

void libdeflate_init_x86_cpu_features(void)
{
	u32 max_leaf;
	u32 manufacturer[3];
	u32 family, model;
	u32 a, b, c, d;
	u64 xcr0 = 0;
	u32 features = 0;

	/* EAX=0: Highest Function Parameter and Manufacturer ID */
	cpuid(0, 0, &max_leaf, &manufacturer[0], &manufacturer[2],
	      &manufacturer[1]);
	if (max_leaf < 1)
		goto out;

	/* EAX=1: Processor Info and Feature Bits */
	cpuid(1, 0, &a, &b, &c, &d);
	family = (a >> 8) & 0xf;
	model = (a >> 4) & 0xf;
	if (family == 6 || family == 0xf)
		model += (a >> 12) & 0xf0;
	if (family == 0xf)
		family += (a >> 20) & 0xff;
	if (d & (1 << 26))
		features |= X86_CPU_FEATURE_SSE2;
	/*
	 * No known CPUs have pclmulqdq without sse4.1, so in practice code
	 * targeting pclmulqdq can use sse4.1 instructions.  But to be safe,
	 * explicitly check for both the pclmulqdq and sse4.1 bits.
	 */
	if ((c & (1 << 1)) && (c & (1 << 19)))
		features |= X86_CPU_FEATURE_PCLMULQDQ;
	if (c & (1 << 27))
		xcr0 = read_xcr(0);
	if ((c & (1 << 28)) && ((xcr0 & 0x6) == 0x6))
		features |= X86_CPU_FEATURE_AVX;

	if (max_leaf < 7)
		goto out;

	/* EAX=7, ECX=0: Extended Features */
	cpuid(7, 0, &a, &b, &c, &d);
	if (b & (1 << 8))
		features |= X86_CPU_FEATURE_BMI2;
	if ((xcr0 & 0x6) == 0x6) {
		if (b & (1 << 5))
			features |= X86_CPU_FEATURE_AVX2;
		if (c & (1 << 10))
			features |= X86_CPU_FEATURE_VPCLMULQDQ;
	}
	if (os_supports_avx512(xcr0)) {
		if (allow_512bit_vectors(manufacturer, family, model))
			features |= X86_CPU_FEATURE_ZMM;
		if (b & (1 << 30))
			features |= X86_CPU_FEATURE_AVX512BW;
		if (b & (1U << 31))
			features |= X86_CPU_FEATURE_AVX512VL;
		if (c & (1 << 11))
			features |= X86_CPU_FEATURE_AVX512VNNI;
	}

	/* EAX=7, ECX=1: Extended Features */
	cpuid(7, 1, &a, &b, &c, &d);
	if ((a & (1 << 4)) && ((xcr0 & 0x6) == 0x6))
		features |= X86_CPU_FEATURE_AVXVNNI;

out:
	disable_cpu_features_for_testing(&features, x86_cpu_feature_table,
					 ARRAY_LEN(x86_cpu_feature_table));

	libdeflate_x86_cpu_features = features | X86_CPU_FEATURES_KNOWN;
}